

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderTextureImplFBO.cpp
# Opt level: O0

bool __thiscall sf::priv::RenderTextureImplFBO::activate(RenderTextureImplFBO *this,bool active)

{
  _func_void_GLenum_GLuint *p_Var1;
  bool bVar2;
  Context *this_00;
  ostream *poVar3;
  pointer ppVar4;
  _Self local_70;
  _Base_ptr local_68;
  int local_5c;
  _Self local_58;
  _Base_ptr local_50;
  _Rb_tree_iterator<std::pair<const_unsigned_long_long,_unsigned_int>_> local_48;
  iterator iter;
  Lock lock;
  Uint64 local_28;
  Uint64 contextId;
  RenderTextureImplFBO *pRStack_18;
  bool active_local;
  RenderTextureImplFBO *this_local;
  
  contextId._7_1_ = active;
  pRStack_18 = this;
  if (!active) {
    (*sf_ptrc_glBindFramebufferEXT)(0x8d40,0);
    glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/sfml-src/src/SFML/Graphics/RenderTextureImplFBO.cpp"
                 ,0x1fd,"GLEXT_glBindFramebuffer(GLEXT_GL_FRAMEBUFFER, 0)");
    this_local._7_1_ = 1;
    goto LAB_001850cc;
  }
  local_28 = Context::getActiveContextId();
  if (local_28 == 0) {
    if (this->m_context == (Context *)0x0) {
      this_00 = (Context *)operator_new(8);
      Context::Context(this_00);
      this->m_context = this_00;
    }
    Context::setActive(this->m_context,true);
    local_28 = Context::getActiveContextId();
    if (local_28 == 0) {
      poVar3 = err();
      poVar3 = std::operator<<(poVar3,
                               "Impossible to activate render texture (failed to create backup context)"
                              );
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      this_local._7_1_ = 0;
      goto LAB_001850cc;
    }
  }
  Lock::Lock((Lock *)&iter,(Mutex *)&(anonymous_namespace)::mutex);
  std::_Rb_tree_iterator<std::pair<const_unsigned_long_long,_unsigned_int>_>::_Rb_tree_iterator
            (&local_48);
  if ((this->m_multisample & 1U) == 0) {
    local_68 = (_Base_ptr)
               std::
               map<unsigned_long_long,_unsigned_int,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>
               ::find(&this->m_frameBuffers,&local_28);
    local_48._M_node = local_68;
    local_70._M_node =
         (_Base_ptr)
         std::
         map<unsigned_long_long,_unsigned_int,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>
         ::end(&this->m_frameBuffers);
    bVar2 = std::operator!=(&local_48,&local_70);
    p_Var1 = sf_ptrc_glBindFramebufferEXT;
    if (!bVar2) goto LAB_001850a3;
    ppVar4 = std::_Rb_tree_iterator<std::pair<const_unsigned_long_long,_unsigned_int>_>::operator->
                       (&local_48);
    (*p_Var1)(0x8d40,ppVar4->second);
    glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/sfml-src/src/SFML/Graphics/RenderTextureImplFBO.cpp"
                 ,0x22f,"GLEXT_glBindFramebuffer(GLEXT_GL_FRAMEBUFFER, iter->second)");
    this_local._7_1_ = 1;
    local_5c = 1;
  }
  else {
    local_50 = (_Base_ptr)
               std::
               map<unsigned_long_long,_unsigned_int,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>
               ::find(&this->m_multisampleFrameBuffers,&local_28);
    local_48._M_node = local_50;
    local_58._M_node =
         (_Base_ptr)
         std::
         map<unsigned_long_long,_unsigned_int,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>
         ::end(&this->m_multisampleFrameBuffers);
    bVar2 = std::operator!=(&local_48,&local_58);
    p_Var1 = sf_ptrc_glBindFramebufferEXT;
    if (bVar2) {
      ppVar4 = std::_Rb_tree_iterator<std::pair<const_unsigned_long_long,_unsigned_int>_>::
               operator->(&local_48);
      (*p_Var1)(0x8d40,ppVar4->second);
      glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/sfml-src/src/SFML/Graphics/RenderTextureImplFBO.cpp"
                   ,0x224,"GLEXT_glBindFramebuffer(GLEXT_GL_FRAMEBUFFER, iter->second)");
      this_local._7_1_ = 1;
      local_5c = 1;
    }
    else {
LAB_001850a3:
      local_5c = 0;
    }
  }
  Lock::~Lock((Lock *)&iter);
  if (local_5c == 0) {
    this_local._7_1_ = createFrameBuffer(this);
  }
LAB_001850cc:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool RenderTextureImplFBO::activate(bool active)
{
    // Unbind the FBO if requested
    if (!active)
    {
        glCheck(GLEXT_glBindFramebuffer(GLEXT_GL_FRAMEBUFFER, 0));
        return true;
    }

    Uint64 contextId = Context::getActiveContextId();

    // In the odd case we have to activate and there is no active
    // context yet, we have to create one
    if (!contextId)
    {
        if (!m_context)
            m_context = new Context;

        m_context->setActive(true);

        contextId = Context::getActiveContextId();

        if (!contextId)
        {
            err() << "Impossible to activate render texture (failed to create backup context)" << std::endl;

            return false;
        }
    }

    // Lookup the FBO corresponding to the currently active context
    // If none is found, there is no FBO corresponding to the
    // currently active context so we will have to create a new FBO
    {
        Lock lock(mutex);

        std::map<Uint64, unsigned int>::iterator iter;
        
        if (m_multisample)
        {
            iter = m_multisampleFrameBuffers.find(contextId);

            if (iter != m_multisampleFrameBuffers.end())
            {
                glCheck(GLEXT_glBindFramebuffer(GLEXT_GL_FRAMEBUFFER, iter->second));

                return true;
            }
        }
        else
        {
            iter = m_frameBuffers.find(contextId);

            if (iter != m_frameBuffers.end())
            {
                glCheck(GLEXT_glBindFramebuffer(GLEXT_GL_FRAMEBUFFER, iter->second));

                return true;
            }
        }
    }

    return createFrameBuffer();
}